

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall ncnn::Convolution_x86::create_pipeline_int8_x86(Convolution_x86 *this,Option *opt)

{
  int iVar1;
  ulong uVar2;
  long in_RSI;
  long *in_RDI;
  int num_input;
  int kernel_size;
  int in_stack_000000c0;
  int in_stack_000000c4;
  Mat *in_stack_000000c8;
  Mat *in_stack_000000d0;
  
  uVar2 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) /
          (long)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) *
                *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0));
  iVar1 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
  *(undefined1 *)(in_RDI + 0x17) = 0;
  if (((((((*(byte *)(in_RSI + 0x18) & 1) != 0) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 3)) &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 3)) &&
       ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) == 1 &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) == 1)))) &&
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) == 1 &&
       ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1 &&
        (0xf < (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                    (long)iVar1))))))) &&
     (0xf < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8))) {
    *(undefined1 *)(in_RDI + 0x17) = 1;
    conv3x3s1_winograd23_transform_kernel_int8_sse
              (in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000c0);
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline_int8_x86(const Option& opt)
{
    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    use_winograd3x3_int8 = false;

    if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1
        && num_input >= 16 && num_output >= 16)
    {
        // winograd is slow on small channel count
        use_winograd3x3_int8 = true;

        conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data_int8, num_input, num_output);
//         conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data_int8, num_input, num_output);
    }
    else
    {
        // TODO offline transform weight
    }

    return 0;
}